

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::fixXfbOffsets
          (HlslParseContext *this,TQualifier *qualifier,TTypeList *typeList)

{
  pointer pTVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool contains16BitType;
  bool contains32BitType;
  bool contains64BitType;
  uint local_3c;
  TQualifier *local_38;
  long lVar4;
  
  uVar6 = (uint)*(undefined8 *)&qualifier->field_0x24;
  uVar5 = ~uVar6;
  if ((uVar5 & 0x7ffc0000) != 0 && (uVar5 & 0xf) != 0) {
    local_3c = uVar6 >> 0x12 & 0x1fff;
    uVar6 = 0;
    local_38 = qualifier;
    while( true ) {
      uVar7 = (ulong)uVar6;
      pTVar1 = (typeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(typeList->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ).
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 5) <= uVar7)
      break;
      iVar2 = (*(pTVar1[uVar7].type)->_vptr_TType[10])();
      lVar4 = CONCAT44(extraout_var,iVar2);
      contains64BitType = false;
      contains32BitType = false;
      contains16BitType = false;
      uVar5 = TIntermediate::computeTypeXfbSize
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         (typeList->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ).
                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar7].type,&contains64BitType,
                         &contains32BitType,&contains16BitType);
      uVar3 = (uint)*(undefined8 *)(lVar4 + 0x24);
      if ((~uVar3 & 0x7ffc0000) == 0) {
        iVar2 = 8;
        if (contains64BitType == false) {
          iVar2 = 4;
          if (contains32BitType != false) goto LAB_0039c49e;
          iVar2 = 2;
          if (contains16BitType == true) goto LAB_0039c49e;
        }
        else {
LAB_0039c49e:
          RoundToPow2<int>((int *)&local_3c,iVar2);
        }
        *(ulong *)(lVar4 + 0x24) =
             *(ulong *)(lVar4 + 0x24) & 0xffffffff8003ffff | (ulong)((local_3c & 0x1fff) << 0x12);
      }
      else {
        local_3c = uVar3 >> 0x12 & 0x1fff;
      }
      local_3c = local_3c + uVar5;
      uVar6 = uVar6 + 1;
    }
    *(ushort *)&local_38->field_0x26 = *(ushort *)&local_38->field_0x26 | 0x7ffc;
  }
  return;
}

Assistant:

void HlslParseContext::fixXfbOffsets(TQualifier& qualifier, TTypeList& typeList)
{
    // "If a block is qualified with xfb_offset, all its
    // members are assigned transform feedback buffer offsets. If a block is not qualified with xfb_offset, any
    // members of that block not qualified with an xfb_offset will not be assigned transform feedback buffer
    // offsets."

    if (! qualifier.hasXfbBuffer() || ! qualifier.hasXfbOffset())
        return;

    int nextOffset = qualifier.layoutXfbOffset;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        bool contains64BitType = false;
        bool contains32BitType = false;
        bool contains16BitType = false;
        int memberSize = intermediate.computeTypeXfbSize(*typeList[member].type, contains64BitType, contains32BitType, contains16BitType);
        // see if we need to auto-assign an offset to this member
        if (! memberQualifier.hasXfbOffset()) {
            // "if applied to an aggregate containing a double or 64-bit integer, the offset must also be a multiple of 8"
            if (contains64BitType)
                RoundToPow2(nextOffset, 8);
            else if (contains32BitType)
                RoundToPow2(nextOffset, 4);
            // "if applied to an aggregate containing a half float or 16-bit integer, the offset must also be a multiple of 2"
            else if (contains16BitType)
                RoundToPow2(nextOffset, 2);
            memberQualifier.layoutXfbOffset = nextOffset;
        } else
            nextOffset = memberQualifier.layoutXfbOffset;
        nextOffset += memberSize;
    }

    // The above gave all block members an offset, so we can take it off the block now,
    // which will avoid double counting the offset usage.
    qualifier.layoutXfbOffset = TQualifier::layoutXfbOffsetEnd;
}